

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::text_format_unittest::TextFormatTest_Utf8Format_Test::
TextFormatTest_Utf8Format_Test(TextFormatTest_Utf8Format_Test *this)

{
  TextFormatTest::TextFormatTest(&this->super_TextFormatTest);
  (this->super_TextFormatTest).super_TextFormatTestBase.super_Test._vptr_Test =
       (_func_int **)&PTR__TextFormatTest_0163a208;
  return;
}

Assistant:

TEST_F(TextFormatTest, Utf8Format) {
  unittest::RedactedFields proto;
  unittest::TestNestedMessageRedaction redacted_nested_proto;
  unittest::TestNestedMessageRedaction unredacted_nested_proto;
  redacted_nested_proto.set_optional_unredacted_nested_string(
      "\350\260\267\346\255\214");
  unredacted_nested_proto.set_optional_unredacted_nested_string(
      "\350\260\267\346\255\214");
  proto.set_optional_redacted_string("foo");
  proto.set_optional_unredacted_string("bar");
  proto.add_repeated_redacted_string("1");
  proto.add_repeated_redacted_string("2");
  proto.add_repeated_unredacted_string("3");
  proto.add_repeated_unredacted_string("4");
  *proto.mutable_optional_redacted_message() = redacted_nested_proto;
  *proto.mutable_optional_unredacted_message() = unredacted_nested_proto;
  unittest::TestNestedMessageRedaction* redacted_message_1 =
      proto.add_repeated_redacted_message();
  unittest::TestNestedMessageRedaction* redacted_message_2 =
      proto.add_repeated_redacted_message();
  unittest::TestNestedMessageRedaction* unredacted_message_1 =
      proto.add_repeated_unredacted_message();
  unittest::TestNestedMessageRedaction* unredacted_message_2 =
      proto.add_repeated_unredacted_message();
  redacted_message_1->set_optional_unredacted_nested_string("5");
  redacted_message_2->set_optional_unredacted_nested_string("6");
  unredacted_message_1->set_optional_unredacted_nested_string("7");
  unredacted_message_2->set_optional_unredacted_nested_string("8");
  (*proto.mutable_map_redacted_string())["abc"] = "def";
  (*proto.mutable_map_unredacted_string())["ghi"] = "jkl";

  EXPECT_THAT(google::protobuf::Utf8Format(proto),
              testing::MatchesRegex(absl::Substitute(
                  "$1\n"
                  "optional_redacted_string: $0\n"
                  "optional_unredacted_string: \"bar\"\n"
                  "repeated_redacted_string: $0\n"
                  "repeated_redacted_string: $0\n"
                  "repeated_unredacted_string: \"3\"\n"
                  "repeated_unredacted_string: \"4\"\n"
                  "optional_redacted_message: $0\n"
                  "optional_unredacted_message \\{\n  "
                  "optional_unredacted_nested_string: "
                  "\"\xE8\xB0\xB7\xE6\xAD\x8C\"\n\\}\n"
                  "repeated_redacted_message: $0\n"
                  "repeated_unredacted_message \\{\n  "
                  "optional_unredacted_nested_string: \"7\"\n\\}\n"
                  "repeated_unredacted_message \\{\n  "
                  "optional_unredacted_nested_string: \"8\"\n\\}\n"
                  "map_redacted_string: $0\n"
                  "map_unredacted_string \\{\n  "
                  "key: \"ghi\"\n  value: \"jkl\"\n\\}\n",
                  value_replacement, kTextMarkerRegex)));
}